

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *mtctx)

{
  uint uVar1;
  uint uVar2;
  ulong *puVar3;
  long in_RDI;
  size_t flushed;
  size_t produced;
  size_t cResult;
  ZSTDMT_jobDescription *jobPtr;
  uint wJobID;
  uint jobID;
  size_t toFlush;
  ulong local_50;
  ulong local_48;
  size_t local_8;
  
  uVar1 = *(uint *)(in_RDI + 0xbb4);
  if (*(uint *)(in_RDI + 3000) < uVar1) {
    __assert_fail("jobID <= mtctx->nextJobID",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8947,"size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *)");
  }
  if (uVar1 == *(uint *)(in_RDI + 3000)) {
    local_8 = 0;
  }
  else {
    uVar1 = uVar1 & *(uint *)(in_RDI + 0xbb0);
    puVar3 = (ulong *)(*(long *)(in_RDI + 8) + (ulong)uVar1 * 0x1b8);
    pthread_mutex_lock((pthread_mutex_t *)(puVar3 + 2));
    local_48 = puVar3[1];
    uVar2 = ZSTD_isError(0x1e8c0e);
    if (uVar2 != 0) {
      local_48 = 0;
    }
    uVar2 = ZSTD_isError(0x1e8c3a);
    if (uVar2 == 0) {
      local_50 = puVar3[0x35];
    }
    else {
      local_50 = 0;
    }
    if (local_48 < local_50) {
      __assert_fail("flushed <= produced",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8951,"size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *)");
    }
    if (puVar3[0x16] < *puVar3) {
      __assert_fail("jobPtr->consumed <= jobPtr->src.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8952,"size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *)");
    }
    local_8 = local_48 - local_50;
    if ((local_8 == 0) && (puVar3[0x16] <= *puVar3)) {
      __assert_fail("jobPtr->consumed < jobPtr->src.size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x895a,"size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx *)");
    }
    pthread_mutex_unlock((pthread_mutex_t *)(*(long *)(in_RDI + 8) + (ulong)uVar1 * 0x1b8 + 0x10));
  }
  return local_8;
}

Assistant:

size_t ZSTDMT_toFlushNow(ZSTDMT_CCtx* mtctx)
{
    size_t toFlush;
    unsigned const jobID = mtctx->doneJobID;
    assert(jobID <= mtctx->nextJobID);
    if (jobID == mtctx->nextJobID) return 0;   /* no active job => nothing to flush */

    /* look into oldest non-fully-flushed job */
    {   unsigned const wJobID = jobID & mtctx->jobIDMask;
        ZSTDMT_jobDescription* const jobPtr = &mtctx->jobs[wJobID];
        ZSTD_pthread_mutex_lock(&jobPtr->job_mutex);
        {   size_t const cResult = jobPtr->cSize;
            size_t const produced = ZSTD_isError(cResult) ? 0 : cResult;
            size_t const flushed = ZSTD_isError(cResult) ? 0 : jobPtr->dstFlushed;
            assert(flushed <= produced);
            assert(jobPtr->consumed <= jobPtr->src.size);
            toFlush = produced - flushed;
            /* if toFlush==0, nothing is available to flush.
             * However, jobID is expected to still be active:
             * if jobID was already completed and fully flushed,
             * ZSTDMT_flushProduced() should have already moved onto next job.
             * Therefore, some input has not yet been consumed. */
            if (toFlush==0) {
                assert(jobPtr->consumed < jobPtr->src.size);
            }
        }
        ZSTD_pthread_mutex_unlock(&mtctx->jobs[wJobID].job_mutex);
    }

    return toFlush;
}